

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O2

LispPTR CHAR_openfile(LispPTR *args)

{
  int iVar1;
  int __fd;
  uint uVar2;
  LispPTR LVar3;
  LispPTR *pLVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  DLword *pDVar8;
  char pathname [4096];
  
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);
  pLVar4 = NativeAligned4FromLAddr(*args);
  LVar3 = 0x1000;
  if ((int)pLVar4[2] < 0x1000) {
    LVar3 = pLVar4[2];
  }
  lVar5 = (long)(int)LVar3;
  if (*(char *)((long)pLVar4 + 6) == 'D') {
    pDVar8 = Lisp_world + (ulong)(ushort)pLVar4[1] + (ulong)(*pLVar4 & 0xfffffff);
    for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
      pathname[lVar7] = *(char *)((ulong)pDVar8 ^ 2);
      pDVar8 = pDVar8 + 1;
    }
    pathname[lVar7] = '\0';
  }
  else if (*(char *)((long)pLVar4 + 6) == 'C') {
    uVar2 = *pLVar4;
    LVar3 = pLVar4[1];
    for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
      pathname[lVar7] =
           *(char *)((long)Lisp_world +
                     lVar7 + (ulong)(ushort)LVar3 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3);
    }
    pathname[lVar5] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    if (args[1] - 0xe0000 < 4) {
      iVar1 = *(int *)(&DAT_0013ac80 + (ulong)(args[1] - 0xe0000) * 4);
      alarm(TIMEOUT_TIME);
      piVar6 = __errno_location();
      do {
        *piVar6 = 0;
        __fd = open(pathname,iVar1);
        if (__fd != -1) {
          alarm(0);
          uVar2 = fcntl(__fd,3,0);
          fcntl(__fd,4,(ulong)(uVar2 | 0x800));
          LVar3 = GetSmallp((long)__fd);
          return LVar3;
        }
      } while (*piVar6 == 4);
      alarm(0);
      err_mess("open",*piVar6);
      *Lisp_errno = *piVar6;
    }
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR CHAR_openfile(LispPTR *args)
/* args[0]            fullname */
/* args[1]            access */
/* args[2]            errno */
{
#ifndef DOS
  int fd;    /* return value  of open system call. */
  int flags; /* open system call's argument */
  /* struct stat statbuf; */
  char pathname[MAXPATHLEN];

  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);

  LispStringToCString(args[0], pathname, MAXPATHLEN);
  flags = O_NONBLOCK;
  ERRSETJMP(NIL);
  /*    TIMEOUT( rval=stat(pathname, &statbuf) );
      if(rval == 0){      } */
  switch (args[1]) {
    case ACCESS_INPUT: flags |= O_RDONLY; break;
    case ACCESS_OUTPUT: flags |= (O_WRONLY | O_CREAT); break;
    case ACCESS_APPEND: flags |= (O_APPEND | O_RDWR | O_CREAT); break;
    case ACCESS_BOTH: flags |= (O_RDWR | O_CREAT); break;
    default: return (NIL);
  }
  TIMEOUT(fd = open(pathname, flags));
  if (fd == -1) {
    err_mess("open", errno);
    *Lisp_errno = errno;
    return (NIL);
  }
  /* Prevent I/O requests from blocking -- make them error */
  /* if no char is available, or there's no room in pipe.  */
  fcntl(fd, F_SETFL, fcntl(fd, F_GETFL, 0) | O_NONBLOCK);

  return (GetSmallp(fd));
#endif /* DOS */
}